

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scan.hpp
# Opt level: O2

int * Omega_h::transform_inclusive_scan<int*,int*,Omega_h::maximum<int>,Omega_h::identity<int>>
                (int *first,long last,int *result)

{
  long lVar1;
  int iVar2;
  d_t i;
  long lVar3;
  
  lVar1 = last - (long)first >> 2;
  if (0 < lVar1) {
    entering_parallel = 0;
    iVar2 = *first;
    *result = iVar2;
    for (lVar3 = 1; lVar1 != lVar3; lVar3 = lVar3 + 1) {
      if (iVar2 <= first[lVar3]) {
        iVar2 = first[lVar3];
      }
      result[lVar3] = iVar2;
    }
    result = (int *)((long)result + (last - (long)first));
  }
  return result;
}

Assistant:

OutputIterator transform_inclusive_scan(InputIterator first, InputIterator last,
    OutputIterator result, BinaryOp op, UnaryOp&& transform) {
  auto const n = last - first;
  if (n <= 0) return result;
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  auto value = transform_local(first[0]);
  result[0] = value;
  using d_t = typename std::remove_const<decltype(n)>::type;
  for (d_t i = 1; i < n; ++i) {
    value = op(std::move(value), transform_local(first[i]));
    result[i] = value;
  }
  return result + n;
}